

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_solvers.h
# Opt level: O2

void __thiscall
Solver::Solver(Solver *this,SolverFn *solver_fn,uint32_t configuration,string *name,string *desc,
              uint32_t features)

{
  undefined1 auVar1 [16];
  undefined3 uVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  
  this->solve_ = solver_fn;
  this->configuration_ = configuration;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::__cxx11::string::string((string *)&this->desc_,(string *)desc);
  auVar5[8] = 1;
  auVar5._0_8_ = 0x101010101010101;
  auVar5[9] = 1;
  auVar5[10] = 1;
  auVar5[0xb] = 1;
  auVar5[0xc] = 1;
  auVar5[0xd] = 1;
  auVar5[0xe] = 1;
  auVar5[0xf] = 1;
  bVar3 = (byte)features;
  uVar2 = (undefined3)(features >> 8);
  auVar1 = vpinsrb_avx(ZEXT416(features),CONCAT31(uVar2,bVar3 >> 1),1);
  auVar1 = vpinsrb_avx(auVar1,CONCAT31(uVar2,bVar3 >> 2),2);
  auVar1 = vpinsrb_avx(auVar1,CONCAT31(uVar2,bVar3 >> 3),3);
  auVar1 = vpand_avx(auVar1,auVar5);
  uVar4 = auVar1._0_4_;
  this->returns_solution_ = (bool)(char)uVar4;
  this->returns_count_ = (bool)(char)((uint)uVar4 >> 8);
  this->returns_full_count_ = (bool)(char)((uint)uVar4 >> 0x10);
  this->returns_guess_count_ = (bool)(char)((uint)uVar4 >> 0x18);
  return;
}

Assistant:

Solver(SolverFn *solver_fn, uint32_t configuration, std::string name, std::string desc, uint32_t features)
            : solve_(solver_fn), configuration_(configuration), name_(std::move(name)), desc_(std::move(desc)),
              returns_solution_((features & 1u) > 0),
              returns_count_((features & 2u) > 0),
              returns_full_count_((features & 4u) > 0),
              returns_guess_count_((features & 8u) > 0) {}